

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

App_p __thiscall CLI::App::get_subcommand_ptr(App *this,int index)

{
  long lVar1;
  OptionNotFound *this_00;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uindex;
  undefined4 in_register_00000034;
  App_p AVar2;
  string sStack_38;
  
  if ((-1 < (int)in_EDX) &&
     (lVar1 = *(long *)(CONCAT44(in_register_00000034,index) + 0x2c0),
     (ulong)in_EDX < (ulong)(*(long *)(CONCAT44(in_register_00000034,index) + 0x2c8) - lVar1 >> 4)))
  {
    std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *)(lVar1 + (ulong)in_EDX * 0x10))
    ;
    AVar2.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    AVar2.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (App_p)AVar2.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  std::__cxx11::to_string(&sStack_38,in_EDX);
  OptionNotFound::OptionNotFound(this_00,&sStack_38);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE CLI::App_p App::get_subcommand_ptr(int index) const {
    if(index >= 0) {
        auto uindex = static_cast<unsigned>(index);
        if(uindex < subcommands_.size())
            return subcommands_[uindex];
    }
    throw OptionNotFound(std::to_string(index));
}